

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convenience_socket_bases.cpp
# Opt level: O0

void __thiscall
tlm_utils::convenience_socket_base::display_warning(convenience_socket_base *this,char *text)

{
  char *pcVar1;
  ostream *poVar2;
  char *in_RSI;
  long *in_RDI;
  stringstream s;
  string local_1c8 [48];
  stringstream local_198 [12];
  int in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  sc_severity in_stack_fffffffffffffe94;
  
  std::__cxx11::stringstream::stringstream(local_198);
  (**(code **)(*in_RDI + 0x18))();
  pcVar1 = sc_core::sc_object::name((sc_object *)0x2fb4ba);
  poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe78,pcVar1);
  poVar2 = std::operator<<(poVar2,": ");
  std::operator<<(poVar2,in_RSI);
  (**(code **)(*in_RDI + 0x10))();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::c_str();
  sc_core::sc_report_handler::report
            (in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void
convenience_socket_base::display_warning(const char* text) const
{
  std::stringstream s;
  s << get_socket()->name() << ": " << text;
  SC_REPORT_WARNING(get_report_type(), s.str().c_str());
}